

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O1

int SHA512FinalBits(SHA512Context *context,uint8_t message_bits,uint length)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  if (context == (SHA512Context *)0x0) {
    return 1;
  }
  if (length == 0) {
    return 0;
  }
  if (context->Corrupted != 0) {
    return context->Corrupted;
  }
  if (context->Computed != 0) {
    context->Corrupted = 3;
    return 3;
  }
  if (7 < length) {
    context->Corrupted = 4;
    return 4;
  }
  uVar3 = (ulong)length;
  puVar1 = &context->Length_Low;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 + uVar3;
  if (CARRY8(uVar2,uVar3)) {
    iVar4 = 2;
    puVar1 = &context->Length_High;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 == 0) goto LAB_0035d0ec;
  }
  iVar4 = 0;
LAB_0035d0ec:
  context->Corrupted = iVar4;
  SHA384_512Finalize(context,message_bits & ""[uVar3] | SHA256FinalBits::markbit[uVar3]);
  return context->Corrupted;
}

Assistant:

int SHA512FinalBits(SHA512Context *context,
                    uint8_t message_bits, unsigned int length)
{
  static uint8_t masks[8] = {
      /* 0 0b00000000 */ 0x00, /* 1 0b10000000 */ 0x80,
      /* 2 0b11000000 */ 0xC0, /* 3 0b11100000 */ 0xE0,
      /* 4 0b11110000 */ 0xF0, /* 5 0b11111000 */ 0xF8,
      /* 6 0b11111100 */ 0xFC, /* 7 0b11111110 */ 0xFE
  };
  static uint8_t markbit[8] = {
      /* 0 0b10000000 */ 0x80, /* 1 0b01000000 */ 0x40,
      /* 2 0b00100000 */ 0x20, /* 3 0b00010000 */ 0x10,
      /* 4 0b00001000 */ 0x08, /* 5 0b00000100 */ 0x04,
      /* 6 0b00000010 */ 0x02, /* 7 0b00000001 */ 0x01
  };

  if (!context) return shaNull;
  if (!length) return shaSuccess;
  if (context->Corrupted) return context->Corrupted;
  if (context->Computed) return context->Corrupted = shaStateError;
  if (length >= 8) return context->Corrupted = shaBadParam;

  SHA384_512AddLength(context, length);
  SHA384_512Finalize(context, (uint8_t)
    ((message_bits & masks[length]) | markbit[length]));

  return context->Corrupted;
}